

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O0

void nn_sipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_usock *self_00;
  int iVar1;
  uint64_t size_00;
  void *buf;
  nn_fsm *local_40;
  uint64_t size;
  nn_sipc *sipc;
  int rc;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_40 = self;
  if (self == (nn_fsm *)0x0) {
    local_40 = (nn_fsm *)0x0;
  }
  switch(*(undefined4 *)&local_40[1].fn) {
  case 1:
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,0xeb);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,0xfffffffe,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,0xe7);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_streamhdr_start((nn_streamhdr *)&local_40[1].state,(nn_usock *)local_40[1].shutdown_fn,
                       (nn_pipebase *)(local_40 + 6));
    *(undefined4 *)&local_40[1].fn = 2;
    break;
  case 2:
    if (src != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,0x10b);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 1) {
      nn_streamhdr_stop((nn_streamhdr *)&local_40[1].state);
      *(undefined4 *)&local_40[1].fn = 3;
    }
    else {
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_40[1].fn,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
                ,0x107);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)&local_40[1].fn = 6;
      nn_fsm_raise(local_40,(nn_fsm_event *)(local_40 + 0xb),1);
    }
    break;
  case 3:
    if (src != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,0x130);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != 3) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,2,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,300);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar1 = nn_pipebase_start((nn_pipebase *)(local_40 + 6));
    if (iVar1 < 0) {
      *(undefined4 *)&local_40[1].fn = 6;
      nn_fsm_raise(local_40,(nn_fsm_event *)(local_40 + 0xb),1);
    }
    else {
      *(undefined4 *)&local_40[8].ctx = 1;
      nn_usock_recv((nn_usock *)local_40[1].shutdown_fn,(void *)((long)&local_40[8].ctx + 4),9,
                    (int *)0x0);
      *(undefined4 *)&local_40[9].stopped.srcptr = 1;
      *(undefined4 *)&local_40[1].fn = 4;
    }
    break;
  case 4:
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,0x17e);
      fflush(_stderr);
      nn_err_abort();
    }
    switch(type) {
    case 3:
      if (*(int *)&local_40[9].stopped.srcptr != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "sipc->outstate == NN_SIPC_OUTSTATE_SENDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
                ,0x13e);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)&local_40[9].stopped.srcptr = 1;
      nn_msg_term((nn_msg *)&local_40[9].stopped.item);
      nn_msg_init((nn_msg *)&local_40[9].stopped.item,0);
      nn_pipebase_sent((nn_pipebase *)(local_40 + 6));
      break;
    case 4:
      if (*(int *)&local_40[8].ctx == 1) {
        if (*(char *)((long)&local_40[8].ctx + 4) != '\x01') {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sipc->inhdr [0] == NN_SIPC_MSG_NORMAL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
                  ,0x14c);
          fflush(_stderr);
          nn_err_abort();
        }
        size_00 = nn_getll((uint8_t *)((long)&local_40[8].ctx + 5));
        nn_msg_term((nn_msg *)&local_40[8].stopped.src);
        nn_msg_init((nn_msg *)&local_40[8].stopped.src,size_00);
        if (size_00 == 0) {
          *(undefined4 *)&local_40[8].ctx = 3;
          nn_pipebase_received((nn_pipebase *)(local_40 + 6));
        }
        else {
          *(undefined4 *)&local_40[8].ctx = 2;
          self_00 = (nn_usock *)local_40[1].shutdown_fn;
          buf = nn_chunkref_data((nn_chunkref *)&local_40[9].owner);
          nn_usock_recv(self_00,buf,size_00,(int *)0x0);
        }
      }
      else {
        if (*(int *)&local_40[8].ctx != 2) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
                  ,0x16a);
          fflush(_stderr);
          nn_err_abort();
        }
        *(undefined4 *)&local_40[8].ctx = 3;
        nn_pipebase_received((nn_pipebase *)(local_40 + 6));
      }
      break;
    case 5:
      nn_pipebase_stop((nn_pipebase *)(local_40 + 6));
      *(undefined4 *)&local_40[1].fn = 6;
      nn_fsm_raise(local_40,(nn_fsm_event *)(local_40 + 0xb),1);
      break;
    default:
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,0x17a);
      fflush(_stderr);
      nn_err_abort();
    case 8:
      nn_pipebase_stop((nn_pipebase *)(local_40 + 6));
      *(undefined4 *)&local_40[1].fn = 5;
    }
    break;
  case 5:
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,0x194);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != 5) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
              ,400);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)&local_40[1].fn = 6;
    nn_fsm_raise(local_40,(nn_fsm_event *)(local_40 + 0xb),1);
    break;
  case 6:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
            (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
            ,0x19d);
    fflush(_stderr);
    nn_err_abort();
  default:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
            ,0x1a4);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_sipc_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    int rc;
    struct nn_sipc *sipc;
    uint64_t size;

    sipc = nn_cont (self, struct nn_sipc, fsm);


    switch (sipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SIPC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_streamhdr_start (&sipc->streamhdr, sipc->usock,
                    &sipc->pipebase);
                sipc->state = NN_SIPC_STATE_PROTOHDR;
                return;
            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  PROTOHDR state.                                                           */
/******************************************************************************/
    case NN_SIPC_STATE_PROTOHDR:
        switch (src) {

        case NN_SIPC_SRC_STREAMHDR:
            switch (type) {
            case NN_STREAMHDR_OK:

                /*  Before moving to the active state stop the streamhdr
                    state machine. */
                nn_streamhdr_stop (&sipc->streamhdr);
                sipc->state = NN_SIPC_STATE_STOPPING_STREAMHDR;
                return;

            case NN_STREAMHDR_ERROR:

                /* Raise the error and move directly to the DONE state.
                   streamhdr object will be stopped later on. */
                sipc->state = NN_SIPC_STATE_DONE;
                nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                return;

            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_STREAMHDR state.                                                 */
/******************************************************************************/
    case NN_SIPC_STATE_STOPPING_STREAMHDR:
        switch (src) {

        case NN_SIPC_SRC_STREAMHDR:
            switch (type) {
            case NN_STREAMHDR_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&sipc->pipebase);
                 if (nn_slow (rc < 0)) {
                    sipc->state = NN_SIPC_STATE_DONE;
                    nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 sipc->instate = NN_SIPC_INSTATE_HDR;
                 nn_usock_recv (sipc->usock, &sipc->inhdr,
                     sizeof (sipc->inhdr), NULL);

                 /*  Mark the pipe as available for sending. */
                 sipc->outstate = NN_SIPC_OUTSTATE_IDLE;

                 sipc->state = NN_SIPC_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SIPC_STATE_ACTIVE:
        switch (src) {

        case NN_SIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (sipc->outstate == NN_SIPC_OUTSTATE_SENDING);
                sipc->outstate = NN_SIPC_OUTSTATE_IDLE;
                nn_msg_term (&sipc->outmsg);
                nn_msg_init (&sipc->outmsg, 0);
                nn_pipebase_sent (&sipc->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (sipc->instate) {
                case NN_SIPC_INSTATE_HDR:

                    /*  Message header was received. Allocate memory for the
                        message. */
                    nn_assert (sipc->inhdr [0] == NN_SIPC_MSG_NORMAL);
                    size = nn_getll (sipc->inhdr + 1);
                    nn_msg_term (&sipc->inmsg);
                    nn_msg_init (&sipc->inmsg, (size_t) size);

                    /*  Special case when size of the message body is 0. */
                    if (!size) {
                        sipc->instate = NN_SIPC_INSTATE_HASMSG;
                        nn_pipebase_received (&sipc->pipebase);
                        return;
                    }

                    /*  Start receiving the message body. */
                    sipc->instate = NN_SIPC_INSTATE_BODY;
                    nn_usock_recv (sipc->usock,
                        nn_chunkref_data (&sipc->inmsg.body),
                        (size_t) size, NULL);

                    return;

                case NN_SIPC_INSTATE_BODY:

                    /*  Message body was received. Notify the owner that it
                        can receive it. */
                    sipc->instate = NN_SIPC_INSTATE_HASMSG;
                    nn_pipebase_received (&sipc->pipebase);

                    return;

                default:
                    nn_assert (0);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&sipc->pipebase);
                sipc->state = NN_SIPC_STATE_SHUTTING_DOWN;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&sipc->pipebase);
                sipc->state = NN_SIPC_STATE_DONE;
                nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                return;


            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_SIPC_STATE_SHUTTING_DOWN:
        switch (src) {

        case NN_SIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                sipc->state = NN_SIPC_STATE_DONE;
                nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                return;
            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_SIPC_STATE_DONE:
        nn_fsm_bad_source (sipc->state, src, type);


/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sipc->state, src, type);
    }
}